

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath_p.h
# Opt level: O0

void __thiscall
QPainterPathPrivate::QPainterPathPrivate(QPainterPathPrivate *this,QPainterPathPrivate *other)

{
  QList<QPainterPath::Element> *in_RSI;
  QList<QPainterPath::Element> *in_RDI;
  
  QSharedData::QSharedData((QSharedData *)in_RSI,(QSharedData *)in_RDI);
  QList<QPainterPath::Element>::QList(in_RSI,in_RDI);
  std::unique_ptr<QVectorPathConverter,std::default_delete<QVectorPathConverter>>::
  unique_ptr<std::default_delete<QVectorPathConverter>,void>
            ((unique_ptr<QVectorPathConverter,_std::default_delete<QVectorPathConverter>_> *)in_RSI)
  ;
  QList<double>::QList((QList<double> *)in_RSI,(QList<double> *)in_RDI);
  in_RDI[2].d.size = in_RSI[2].d.size;
  in_RDI[3].d.d = in_RSI[3].d.d;
  in_RDI[3].d.ptr = in_RSI[3].d.ptr;
  in_RDI[3].d.size = in_RSI[3].d.size;
  in_RDI[4].d.d = in_RSI[4].d.d;
  in_RDI[4].d.ptr = in_RSI[4].d.ptr;
  in_RDI[4].d.size = in_RSI[4].d.size;
  in_RDI[5].d.d = in_RSI[5].d.d;
  *(undefined4 *)&in_RDI[5].d.ptr = *(undefined4 *)&in_RSI[5].d.ptr;
  *(byte *)((long)&in_RDI[5].d.ptr + 4) = *(byte *)((long)&in_RDI[5].d.ptr + 4) & 0xfe;
  *(byte *)((long)&in_RDI[5].d.ptr + 4) =
       *(byte *)((long)&in_RDI[5].d.ptr + 4) & 0xfd |
       (*(byte *)((long)&in_RSI[5].d.ptr + 4) >> 1 & 1) << 1;
  *(byte *)((long)&in_RDI[5].d.ptr + 4) =
       *(byte *)((long)&in_RDI[5].d.ptr + 4) & 0xfb |
       (*(byte *)((long)&in_RSI[5].d.ptr + 4) >> 2 & 1) << 2;
  *(byte *)((long)&in_RDI[5].d.ptr + 4) =
       *(byte *)((long)&in_RDI[5].d.ptr + 4) & 0xf7 |
       (*(byte *)((long)&in_RSI[5].d.ptr + 4) >> 3 & 1) << 3;
  *(byte *)((long)&in_RDI[5].d.ptr + 4) =
       *(byte *)((long)&in_RDI[5].d.ptr + 4) & 0xef |
       (*(byte *)((long)&in_RSI[5].d.ptr + 4) >> 4 & 1) << 4;
  *(byte *)((long)&in_RDI[5].d.ptr + 4) =
       *(byte *)((long)&in_RDI[5].d.ptr + 4) & 0xdf |
       (*(byte *)((long)&in_RSI[5].d.ptr + 4) >> 5 & 1) << 5;
  *(byte *)((long)&in_RDI[5].d.ptr + 4) =
       *(byte *)((long)&in_RDI[5].d.ptr + 4) & 0xbf |
       (*(byte *)((long)&in_RSI[5].d.ptr + 4) >> 6 & 1) << 6;
  return;
}

Assistant:

QPainterPathPrivate(const QPainterPathPrivate &other) noexcept
        : QSharedData(other),
          elements(other.elements),
          m_runLengths(other.m_runLengths),
          bounds(other.bounds),
          controlBounds(other.controlBounds),
          cStart(other.cStart),
          require_moveTo(false),
          dirtyBounds(other.dirtyBounds),
          dirtyControlBounds(other.dirtyControlBounds),
          dirtyRunLengths(other.dirtyRunLengths),
          convex(other.convex),
          hasWindingFill(other.hasWindingFill),
          cacheEnabled(other.cacheEnabled)
    {
    }